

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O1

string * __thiscall
cmNinjaTargetGenerator::ComputeFlagsForObject
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,cmSourceFile *source,
          string *language,string *config)

{
  cmLocalNinjaGenerator *pcVar1;
  pointer pcVar2;
  cmGeneratorTarget *headTarget;
  cmTarget *this_00;
  _Base_ptr p_Var3;
  _Base_ptr __n;
  cmMakefile *pcVar4;
  pointer pbVar5;
  pointer puVar6;
  int iVar7;
  string *psVar8;
  cmValue cVar9;
  iterator iVar10;
  string *psVar11;
  cmFileSet *this_01;
  _Rb_tree_node_base *p_Var12;
  string *psVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *filename;
  pointer arch;
  _Base_ptr p_Var14;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *entry;
  pointer cge;
  _Alloc_hider _Var15;
  size_type __rlen;
  bool bVar16;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  files;
  string file_set_type;
  string pchOptions;
  _Alloc_hider local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  undefined8 local_2d8;
  char *local_2d0;
  size_type local_2c8;
  pointer local_2c0;
  undefined8 local_2b8;
  char *local_2b0;
  string COMPILE_OPTIONS;
  string COMPILE_FLAGS;
  string filterArch;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  architectures;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  fileEntries;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  cmGeneratorExpressionInterpreter genexInterpreter;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directories;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  directoryEntries;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pchSources;
  
  architectures.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  architectures.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  architectures.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pchSources._M_h._M_buckets = &pchSources._M_h._M_single_bucket;
  pchSources._M_h._M_bucket_count = 1;
  pchSources._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  pchSources._M_h._M_element_count = 0;
  pchSources._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  pchSources._M_h._M_rehash_policy._M_next_resize = 0;
  pchSources._M_h._M_single_bucket = (__node_base_ptr)0x0;
  cmGeneratorTarget::GetAppleArchs
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,config,&architectures);
  if (architectures.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      architectures.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::emplace_back<>(&architectures);
  }
  pbVar5 = architectures.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  filterArch._M_dataplus._M_p = (pointer)&filterArch.field_2;
  filterArch._M_string_length = 0;
  filterArch.field_2._M_local_buf[0] = '\0';
  if (architectures.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      architectures.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    arch = architectures.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    do {
      cmGeneratorTarget::GetPchSource
                ((string *)&genexInterpreter,(this->super_cmCommonTargetGenerator).GeneratorTarget,
                 config,language,arch);
      psVar8 = cmSourceFile::GetFullPath_abi_cxx11_(source);
      if ((genexInterpreter.GeneratorExpression.Backtrace.
           super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi ==
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psVar8->_M_string_length) &&
         ((genexInterpreter.GeneratorExpression.Backtrace.
           super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0 ||
          (iVar7 = bcmp(genexInterpreter.GeneratorExpression.Backtrace.
                        super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,(psVar8->_M_dataplus)._M_p,
                        (size_t)genexInterpreter.GeneratorExpression.Backtrace.
                                super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi), iVar7 == 0)))) {
        std::__cxx11::string::_M_assign((string *)&filterArch);
      }
      if (genexInterpreter.GeneratorExpression.Backtrace.
          super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pchOptions,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &genexInterpreter,arch);
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&pchSources,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pchOptions);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8._M_p != &local_2e8) {
          operator_delete(local_2f8._M_p,local_2e8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pchOptions._M_dataplus._M_p != &pchOptions.field_2) {
          operator_delete(pchOptions._M_dataplus._M_p,pchOptions.field_2._M_allocated_capacity + 1);
        }
      }
      if (genexInterpreter.GeneratorExpression.Backtrace.
          super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr != (element_type *)&genexInterpreter.CompiledGeneratorExpression) {
        operator_delete(genexInterpreter.GeneratorExpression.Backtrace.
                        super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,(long)genexInterpreter.CompiledGeneratorExpression._M_t.
                                      super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                                      .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>
                                      ._M_head_impl + 1);
      }
      arch = arch + 1;
    } while (arch != pbVar5);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  cmGeneratorTarget::AddExplicitLanguageFlags
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,__return_storage_ptr__,source);
  if (__return_storage_ptr__->_M_string_length != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  cmCommonTargetGenerator::GetFlags
            (&pchOptions,&this->super_cmCommonTargetGenerator,language,config,&filterArch);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)pchOptions._M_dataplus._M_p)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pchOptions._M_dataplus._M_p != &pchOptions.field_2) {
    operator_delete(pchOptions._M_dataplus._M_p,pchOptions.field_2._M_allocated_capacity + 1);
  }
  iVar7 = std::__cxx11::string::compare((char *)language);
  if (iVar7 == 0) {
    cmCommonTargetGenerator::AppendFortranFormatFlags
              (&this->super_cmCommonTargetGenerator,__return_storage_ptr__,source);
    cmCommonTargetGenerator::AppendFortranPreprocessFlags
              (&this->super_cmCommonTargetGenerator,__return_storage_ptr__,source,NO);
  }
  pcVar1 = this->LocalGenerator;
  pcVar2 = (config->_M_dataplus)._M_p;
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_150,pcVar2,pcVar2 + config->_M_string_length);
  headTarget = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  pcVar2 = (language->_M_dataplus)._M_p;
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_170,pcVar2,pcVar2 + language->_M_string_length);
  cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
            (&genexInterpreter,(cmLocalGenerator *)pcVar1,&local_150,headTarget,&local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  COMPILE_FLAGS._M_dataplus._M_p = (pointer)&COMPILE_FLAGS.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&COMPILE_FLAGS,"COMPILE_FLAGS","");
  cVar9 = cmSourceFile::GetProperty(source,&COMPILE_FLAGS);
  if (cVar9.Value != (string *)0x0) {
    pcVar1 = this->LocalGenerator;
    pcVar2 = ((cVar9.Value)->_M_dataplus)._M_p;
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_190,pcVar2,pcVar2 + (cVar9.Value)->_M_string_length);
    psVar8 = cmGeneratorExpressionInterpreter::Evaluate(&genexInterpreter,&local_190,&COMPILE_FLAGS)
    ;
    (*(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[6])
              (pcVar1,__return_storage_ptr__,psVar8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
  }
  COMPILE_OPTIONS._M_dataplus._M_p = (pointer)&COMPILE_OPTIONS.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&COMPILE_OPTIONS,"COMPILE_OPTIONS","");
  cVar9 = cmSourceFile::GetProperty(source,&COMPILE_OPTIONS);
  if (cVar9.Value != (string *)0x0) {
    pcVar1 = this->LocalGenerator;
    pcVar2 = ((cVar9.Value)->_M_dataplus)._M_p;
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b0,pcVar2,pcVar2 + (cVar9.Value)->_M_string_length);
    psVar8 = cmGeneratorExpressionInterpreter::Evaluate
                       (&genexInterpreter,&local_1b0,&COMPILE_OPTIONS);
    cmLocalGenerator::AppendCompileOptions
              ((cmLocalGenerator *)pcVar1,__return_storage_ptr__,psVar8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
  }
  if (pchSources._M_h._M_element_count == 0) {
    bVar16 = false;
  }
  else {
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1d0,"SKIP_PRECOMPILE_HEADERS","");
    cVar9 = cmSourceFile::GetProperty(source,&local_1d0);
    bVar16 = cVar9.Value == (string *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
  }
  if (!bVar16) goto LAB_003fa058;
  pchOptions._M_dataplus._M_p = (pointer)&pchOptions.field_2;
  pchOptions._M_string_length = 0;
  pchOptions.field_2._M_allocated_capacity =
       pchOptions.field_2._M_allocated_capacity & 0xffffffffffffff00;
  psVar8 = cmSourceFile::GetFullPath_abi_cxx11_(source);
  iVar10 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find(&pchSources._M_h,psVar8);
  if (iVar10.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    file_set_type._M_string_length = 0;
    file_set_type.field_2._M_local_buf[0] = '\0';
    file_set_type._M_dataplus._M_p = (pointer)&file_set_type.field_2;
    cmGeneratorTarget::GetPchUseCompileOptions
              ((string *)&files,(this->super_cmCommonTargetGenerator).GeneratorTarget,config,
               language,&file_set_type);
    std::__cxx11::string::operator=((string *)&pchOptions,(string *)&files);
    if ((_Base_ptr *)files._M_t._M_impl._0_8_ !=
        &files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)files._M_t._M_impl._0_8_,
                      (ulong)((long)&(files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
                                     ->_M_color + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)file_set_type._M_dataplus._M_p != &file_set_type.field_2) {
      p_Var14 = (_Base_ptr)
                CONCAT71(file_set_type.field_2._M_allocated_capacity._1_7_,
                         file_set_type.field_2._M_local_buf[0]);
      _Var15._M_p = file_set_type._M_dataplus._M_p;
      goto LAB_003f9fb5;
    }
  }
  else {
    cmGeneratorTarget::GetPchCreateCompileOptions
              ((string *)&files,(this->super_cmCommonTargetGenerator).GeneratorTarget,config,
               language,(string *)
                        ((long)iVar10.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                               ._M_cur + 0x28));
    std::__cxx11::string::operator=((string *)&pchOptions,(string *)&files);
    p_Var14 = files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    _Var15._M_p = (pointer)files._M_t._M_impl._0_8_;
    if ((_Base_ptr *)files._M_t._M_impl._0_8_ !=
        &files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
LAB_003f9fb5:
      operator_delete(_Var15._M_p,(ulong)((long)&p_Var14->_M_color + 1));
    }
  }
  pcVar1 = this->LocalGenerator;
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f0,pchOptions._M_dataplus._M_p,
             pchOptions._M_dataplus._M_p + pchOptions._M_string_length);
  psVar8 = cmGeneratorExpressionInterpreter::Evaluate(&genexInterpreter,&local_1f0,&COMPILE_OPTIONS)
  ;
  cmLocalGenerator::AppendCompileOptions
            ((cmLocalGenerator *)pcVar1,__return_storage_ptr__,psVar8,(char *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pchOptions._M_dataplus._M_p != &pchOptions.field_2) {
    operator_delete(pchOptions._M_dataplus._M_p,pchOptions.field_2._M_allocated_capacity + 1);
  }
LAB_003fa058:
  psVar11 = cmSourceFile::GetFullPath_abi_cxx11_(source);
  this_00 = ((this->super_cmCommonTargetGenerator).GeneratorTarget)->Target;
  file_set_type._M_dataplus._M_p = (pointer)&file_set_type.field_2;
  file_set_type._M_string_length = 0;
  file_set_type.field_2._M_local_buf[0] = '\0';
  cmTarget::GetAllFileSetNames_abi_cxx11_(&local_118,this_00);
  psVar8 = local_118.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (psVar8 == local_118.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)file_set_type._M_dataplus._M_p != &file_set_type.field_2) {
        operator_delete(file_set_type._M_dataplus._M_p,
                        CONCAT71(file_set_type.field_2._M_allocated_capacity._1_7_,
                                 file_set_type.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)COMPILE_OPTIONS._M_dataplus._M_p != &COMPILE_OPTIONS.field_2) {
        operator_delete(COMPILE_OPTIONS._M_dataplus._M_p,
                        COMPILE_OPTIONS.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)COMPILE_FLAGS._M_dataplus._M_p != &COMPILE_FLAGS.field_2) {
        operator_delete(COMPILE_FLAGS._M_dataplus._M_p,
                        COMPILE_FLAGS.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)genexInterpreter.Language._M_dataplus._M_p != &genexInterpreter.Language.field_2) {
        operator_delete(genexInterpreter.Language._M_dataplus._M_p,
                        genexInterpreter.Language.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)genexInterpreter.Config._M_dataplus._M_p != &genexInterpreter.Config.field_2) {
        operator_delete(genexInterpreter.Config._M_dataplus._M_p,
                        genexInterpreter.Config.field_2._M_allocated_capacity + 1);
      }
      std::
      unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
      ::~unique_ptr(&genexInterpreter.CompiledGeneratorExpression);
      cmGeneratorExpression::~cmGeneratorExpression(&genexInterpreter.GeneratorExpression);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)filterArch._M_dataplus._M_p != &filterArch.field_2) {
        operator_delete(filterArch._M_dataplus._M_p,
                        CONCAT71(filterArch.field_2._M_allocated_capacity._1_7_,
                                 filterArch.field_2._M_local_buf[0]) + 1);
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&pchSources._M_h);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&architectures);
      return __return_storage_ptr__;
    }
    this_01 = cmTarget::GetFileSet(this_00,psVar8);
    if (this_01 == (cmFileSet *)0x0) {
      pcVar4 = (this->super_cmCommonTargetGenerator).Makefile;
      psVar13 = cmTarget::GetName_abi_cxx11_(this_00);
      pchOptions.field_2._8_8_ = (psVar13->_M_dataplus)._M_p;
      pchOptions.field_2._M_allocated_capacity = psVar13->_M_string_length;
      pchOptions._M_dataplus._M_p = (pointer)0x8;
      pchOptions._M_string_length = (long)"\nTarget \"" + 1;
      local_2e8._8_8_ = (psVar8->_M_dataplus)._M_p;
      local_2e8._M_allocated_capacity = psVar8->_M_string_length;
      local_2d8 = 0x18;
      local_2d0 = "\", but it was not found.";
      views._M_len = 5;
      views._M_array = (iterator)&pchOptions;
      cmCatViews_abi_cxx11_((string *)&files,views);
      cmMakefile::IssueMessage(pcVar4,INTERNAL_ERROR,(string *)&files);
      if ((_Base_ptr *)files._M_t._M_impl._0_8_ !=
          &files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)files._M_t._M_impl._0_8_,
                        (ulong)((long)&(files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                                       )->_M_color + 1));
      }
    }
    else {
      cmFileSet::CompileFileEntries(&fileEntries,this_01);
      cmFileSet::CompileDirectoryEntries(&directoryEntries,this_01);
      cmFileSet::EvaluateDirectoryEntries
                (&directories,this_01,&directoryEntries,(cmLocalGenerator *)this->LocalGenerator,
                 config,(this->super_cmCommonTargetGenerator).GeneratorTarget,
                 (cmGeneratorExpressionDAGChecker *)0x0);
      puVar6 = fileEntries.
               super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      files._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      files._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &files._M_t._M_impl.super__Rb_tree_header._M_header;
      files._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      files._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           files._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (cge = fileEntries.
                 super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; cge != puVar6; cge = cge + 1) {
        cmFileSet::EvaluateFileEntry
                  (this_01,&directories,&files,cge,(cmLocalGenerator *)this->LocalGenerator,config,
                   (this->super_cmCommonTargetGenerator).GeneratorTarget,
                   (cmGeneratorExpressionDAGChecker *)0x0);
      }
      p_Var12 = files._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((_Rb_tree_header *)files._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
          &files._M_t._M_impl.super__Rb_tree_header) {
        do {
          p_Var3 = p_Var12[2]._M_parent;
          for (p_Var14 = *(_Base_ptr *)(p_Var12 + 2); p_Var14 != p_Var3; p_Var14 = p_Var14 + 1) {
            while( true ) {
              __n = p_Var14->_M_parent;
              if (__n == (_Base_ptr)psVar11->_M_string_length) {
                if (__n == (_Base_ptr)0x0) {
                  bVar16 = true;
                }
                else {
                  iVar7 = bcmp(*(void **)p_Var14,(psVar11->_M_dataplus)._M_p,(size_t)__n);
                  bVar16 = iVar7 == 0;
                }
              }
              else {
                bVar16 = false;
              }
              if (!bVar16) break;
              std::__cxx11::string::_M_assign((string *)&file_set_type);
              p_Var14 = p_Var14 + 1;
              if (bVar16 || p_Var14 == p_Var3) goto LAB_003fa205;
            }
          }
LAB_003fa205:
          p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
        } while ((_Rb_tree_header *)p_Var12 != &files._M_t._M_impl.super__Rb_tree_header);
      }
      if (file_set_type._M_string_length == 0xb) {
        iVar7 = bcmp(file_set_type._M_dataplus._M_p,"CXX_MODULES",0xb);
joined_r0x003fa33a:
        if (iVar7 == 0) {
          cmSourceFile::GetLanguage_abi_cxx11_(&pchOptions,source);
          _Var15 = pchOptions._M_dataplus;
          bVar16 = true;
          if (pchOptions._M_string_length == 3) {
            iVar7 = bcmp(pchOptions._M_dataplus._M_p,"CXX",3);
            bVar16 = iVar7 != 0;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var15._M_p != &pchOptions.field_2) {
            operator_delete(_Var15._M_p,pchOptions.field_2._M_allocated_capacity + 1);
          }
          if (bVar16) {
            pcVar4 = (this->super_cmCommonTargetGenerator).Makefile;
            psVar13 = cmTarget::GetName_abi_cxx11_(this_00);
            pchOptions.field_2._8_8_ = (psVar13->_M_dataplus)._M_p;
            pchOptions.field_2._M_allocated_capacity = psVar13->_M_string_length;
            pchOptions._M_dataplus._M_p = (pointer)0x8;
            pchOptions._M_string_length = (long)"\nTarget \"" + 1;
            local_2e8._8_8_ = (psVar11->_M_dataplus)._M_p;
            local_2e8._M_allocated_capacity = psVar11->_M_string_length;
            local_2d8 = 0x18;
            local_2d0 = "\nin a file set of type \"";
            local_2c8 = file_set_type._M_string_length;
            local_2c0 = file_set_type._M_dataplus._M_p;
            local_2b8 = 0x35;
            local_2b0 = "\" but the source is not classified as a \"CXX\" source.";
            views_00._M_len = 7;
            views_00._M_array = (iterator)&pchOptions;
            cmCatViews_abi_cxx11_(&local_210,views_00);
            cmMakefile::IssueMessage(pcVar4,FATAL_ERROR,&local_210);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_210._M_dataplus._M_p != &local_210.field_2) {
              operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
      }
      else if (file_set_type._M_string_length == 0x17) {
        iVar7 = bcmp(file_set_type._M_dataplus._M_p,"CXX_MODULE_HEADER_UNITS",0x17);
        goto joined_r0x003fa33a;
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~_Rb_tree(&files._M_t);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&directories);
      std::
      vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
      ::~vector(&directoryEntries);
      std::
      vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
      ::~vector(&fileEntries);
    }
    psVar8 = psVar8 + 1;
  } while( true );
}

Assistant:

std::string cmNinjaTargetGenerator::ComputeFlagsForObject(
  cmSourceFile const* source, const std::string& language,
  const std::string& config)
{
  std::vector<std::string> architectures;
  std::unordered_map<std::string, std::string> pchSources;
  this->GeneratorTarget->GetAppleArchs(config, architectures);
  if (architectures.empty()) {
    architectures.emplace_back();
  }

  std::string filterArch;
  for (const std::string& arch : architectures) {
    const std::string pchSource =
      this->GeneratorTarget->GetPchSource(config, language, arch);
    if (pchSource == source->GetFullPath()) {
      filterArch = arch;
    }
    if (!pchSource.empty()) {
      pchSources.insert(std::make_pair(pchSource, arch));
    }
  }

  std::string flags;
  // Explicitly add the explicit language flag before any other flag
  // so user flags can override it.
  this->GeneratorTarget->AddExplicitLanguageFlags(flags, *source);

  if (!flags.empty()) {
    flags += " ";
  }
  flags += this->GetFlags(language, config, filterArch);

  // Add Fortran format flags.
  if (language == "Fortran") {
    this->AppendFortranFormatFlags(flags, *source);
    this->AppendFortranPreprocessFlags(flags, *source,
                                       PreprocessFlagsRequired::NO);
  }

  // Add source file specific flags.
  cmGeneratorExpressionInterpreter genexInterpreter(
    this->LocalGenerator, config, this->GeneratorTarget, language);

  const std::string COMPILE_FLAGS("COMPILE_FLAGS");
  if (cmValue cflags = source->GetProperty(COMPILE_FLAGS)) {
    this->LocalGenerator->AppendFlags(
      flags, genexInterpreter.Evaluate(*cflags, COMPILE_FLAGS));
  }

  const std::string COMPILE_OPTIONS("COMPILE_OPTIONS");
  if (cmValue coptions = source->GetProperty(COMPILE_OPTIONS)) {
    this->LocalGenerator->AppendCompileOptions(
      flags, genexInterpreter.Evaluate(*coptions, COMPILE_OPTIONS));
  }

  // Add precompile headers compile options.
  if (!pchSources.empty() && !source->GetProperty("SKIP_PRECOMPILE_HEADERS")) {
    std::string pchOptions;
    auto pchIt = pchSources.find(source->GetFullPath());
    if (pchIt != pchSources.end()) {
      pchOptions = this->GeneratorTarget->GetPchCreateCompileOptions(
        config, language, pchIt->second);
    } else {
      pchOptions =
        this->GeneratorTarget->GetPchUseCompileOptions(config, language);
    }

    this->LocalGenerator->AppendCompileOptions(
      flags, genexInterpreter.Evaluate(pchOptions, COMPILE_OPTIONS));
  }

  auto const& path = source->GetFullPath();
  auto const* tgt = this->GeneratorTarget->Target;

  std::string file_set_type;

  for (auto const& name : tgt->GetAllFileSetNames()) {
    auto const* file_set = tgt->GetFileSet(name);
    if (!file_set) {
      this->GetMakefile()->IssueMessage(
        MessageType::INTERNAL_ERROR,
        cmStrCat("Target \"", tgt->GetName(),
                 "\" is tracked to have file set \"", name,
                 "\", but it was not found."));
      continue;
    }

    auto fileEntries = file_set->CompileFileEntries();
    auto directoryEntries = file_set->CompileDirectoryEntries();
    auto directories = file_set->EvaluateDirectoryEntries(
      directoryEntries, this->LocalGenerator, config, this->GeneratorTarget);

    std::map<std::string, std::vector<std::string>> files;
    for (auto const& entry : fileEntries) {
      file_set->EvaluateFileEntry(directories, files, entry,
                                  this->LocalGenerator, config,
                                  this->GeneratorTarget);
    }

    for (auto const& it : files) {
      for (auto const& filename : it.second) {
        if (filename == path) {
          file_set_type = file_set->GetType();
          break;
        }
      }
    }

    if (file_set_type == "CXX_MODULES"_s ||
        file_set_type == "CXX_MODULE_HEADER_UNITS"_s) {
      if (source->GetLanguage() != "CXX"_s) {
        this->GetMakefile()->IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat(
            "Target \"", tgt->GetName(), "\" contains the source\n  ", path,
            "\nin a file set of type \"", file_set_type,
            R"(" but the source is not classified as a "CXX" source.)"));
        continue;
      }
    }
  }

  return flags;
}